

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolution.cpp
# Opt level: O1

void __thiscall HighsBasis::print(HighsBasis *this,string *message)

{
  pointer pcVar1;
  pointer pHVar2;
  ulong uVar3;
  string local_38;
  
  if (this->useful == true) {
    pcVar1 = (message->_M_dataplus)._M_p;
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_38,pcVar1,pcVar1 + message->_M_string_length);
    printScalars(this,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    pHVar2 = (this->col_status).
             super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (0 < *(int *)&(this->col_status).
                     super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl
                     .super__Vector_impl_data._M_finish - (int)pHVar2) {
      uVar3 = 0;
      do {
        printf("Basis: col_status[%2d] = %d\n",uVar3 & 0xffffffff,(ulong)pHVar2[uVar3]);
        uVar3 = uVar3 + 1;
        pHVar2 = (this->col_status).
                 super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
                 super__Vector_impl_data._M_start;
      } while ((long)uVar3 <
               (long)(*(int *)&(this->col_status).
                               super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (int)pHVar2));
    }
    pHVar2 = (this->row_status).
             super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (0 < *(int *)&(this->row_status).
                     super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl
                     .super__Vector_impl_data._M_finish - (int)pHVar2) {
      uVar3 = 0;
      do {
        printf("Basis: row_status[%2d] = %d\n",uVar3 & 0xffffffff,(ulong)pHVar2[uVar3]);
        uVar3 = uVar3 + 1;
        pHVar2 = (this->row_status).
                 super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
                 super__Vector_impl_data._M_start;
      } while ((long)uVar3 <
               (long)(*(int *)&(this->row_status).
                               super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (int)pHVar2));
    }
  }
  return;
}

Assistant:

void HighsBasis::print(std::string message) const {
  if (!this->useful) return;
  this->printScalars(message);
  for (HighsInt iCol = 0; iCol < HighsInt(this->col_status.size()); iCol++)
    printf("Basis: col_status[%2d] = %d\n", int(iCol),
           int(this->col_status[iCol]));
  for (HighsInt iRow = 0; iRow < HighsInt(this->row_status.size()); iRow++)
    printf("Basis: row_status[%2d] = %d\n", int(iRow),
           int(this->row_status[iRow]));
}